

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyTableValue::~IfcPropertyTableValue
          (IfcPropertyTableValue *this,void **vtt)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x58 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>)._vptr_ObjectHelper
       = (_func_int **)vtt[0xe];
  p_Var2 = (this->DefinedUnit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->DefiningUnit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pcVar3 = (this->Expression).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->Expression).ptr.field_2) {
    operator_delete(pcVar3);
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(&(this->DefinedValues).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           );
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).
                field_0x10);
  pvVar1 = vtt[2];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
    return;
  }
  return;
}

Assistant:

IfcPropertyTableValue() : Object("IfcPropertyTableValue") {}